

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * cuddCProjectionRecur(DdManager *dd,DdNode *R,DdNode *Y,DdNode *Ysupp)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  DdNode *one;
  uint index;
  uint top;
  uint topY;
  uint topR;
  DdNode *Alpha;
  DdNode *Gamma;
  DdNode *Ran;
  DdNode *Ra;
  DdNode *Yrest;
  DdNode *YE;
  DdNode *YT;
  DdNode *RE;
  DdNode *RT;
  DdNode *y;
  DdNode *r;
  DdNode *resA;
  DdNode *res2;
  DdNode *res1;
  DdNode *res;
  DdNode *Ysupp_local;
  DdNode *Y_local;
  DdNode *R_local;
  DdManager *dd_local;
  
  one._0_4_ = 0;
  pDVar3 = dd->one;
  dd_local = (DdManager *)R;
  if (Y != pDVar3) {
    if (*(int *)((ulong)Y & 0xfffffffffffffffe) == 0x7fffffff) {
      __assert_fail("!Cudd_IsConstant(Y)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                    ,0x5a0,"DdNode *cuddCProjectionRecur(DdManager *, DdNode *, DdNode *, DdNode *)"
                   );
    }
    if ((R != (DdNode *)((ulong)pDVar3 ^ 1)) &&
       (dd_local = (DdManager *)cuddCacheLookup2(dd,Cudd_CProjection,R,Y),
       dd_local == (DdManager *)0x0)) {
      pDVar1 = (DdNode *)((ulong)R & 0xfffffffffffffffe);
      if (pDVar1->index == 0x7fffffff) {
        local_c4 = pDVar1->index;
      }
      else {
        local_c4 = dd->perm[pDVar1->index];
      }
      pDVar2 = (DdNode *)((ulong)Y & 0xfffffffffffffffe);
      if (pDVar2->index == 0x7fffffff) {
        local_c8 = pDVar2->index;
      }
      else {
        local_c8 = dd->perm[pDVar2->index];
      }
      if (local_c8 < local_c4) {
        local_cc = local_c8;
      }
      else {
        local_cc = local_c4;
      }
      YT = R;
      RE = R;
      if (local_c4 == local_cc) {
        one._0_4_ = pDVar1->index;
        RE = (pDVar1->type).kids.T;
        YT = (pDVar1->type).kids.E;
        if (pDVar1 != R) {
          RE = (DdNode *)((ulong)RE ^ 1);
          YT = (DdNode *)((ulong)YT ^ 1);
        }
      }
      if (local_cc < local_c8) {
        pDVar3 = cuddCProjectionRecur(dd,RE,Y,Ysupp);
        if (pDVar3 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
        pDVar1 = cuddCProjectionRecur(dd,YT,Y,Ysupp);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        res1 = cuddBddIteRecur(dd,dd->vars[(DdHalfWord)one],pDVar3,pDVar1);
        if (res1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_RecursiveDeref(dd,pDVar1);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      }
      else {
        YE = (pDVar2->type).kids.T;
        Yrest = (pDVar2->type).kids.E;
        if (pDVar2 != Y) {
          YE = (DdNode *)((ulong)YE ^ 1);
          Yrest = (DdNode *)((ulong)Yrest ^ 1);
        }
        if (YE == (DdNode *)((ulong)pDVar3 ^ 1)) {
          _topY = (DdNode *)((ulong)dd->vars[pDVar2->index] ^ 1);
          Ra = Yrest;
          Ran = YT;
          Gamma = RE;
        }
        else {
          _topY = dd->vars[pDVar2->index];
          Ra = YE;
          Ran = RE;
          Gamma = YT;
        }
        pDVar1 = cuddBddExistAbstractRecur(dd,Ran,(Ysupp->type).kids.T);
        if (pDVar1 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        if (pDVar1 == pDVar3) {
          pDVar3 = cuddCProjectionRecur(dd,Ran,Ra,(Ysupp->type).kids.T);
          if (pDVar3 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          res1 = cuddBddAndRecur(dd,_topY,pDVar3);
          if (res1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
        }
        else if (pDVar1 == (DdNode *)((ulong)pDVar3 ^ 1)) {
          pDVar3 = cuddCProjectionRecur(dd,Gamma,Ra,(Ysupp->type).kids.T);
          if (pDVar3 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          res1 = cuddBddAndRecur(dd,(DdNode *)((ulong)_topY ^ 1),pDVar3);
          if (res1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar3 = cuddCProjectionRecur(dd,Gamma,Ra,(Ysupp->type).kids.T);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar1 ^ 1),pDVar3);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar1);
          Cudd_RecursiveDeref(dd,pDVar3);
          pDVar3 = cuddCProjectionRecur(dd,Ran,Ra,(Ysupp->type).kids.T);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          res1 = cuddBddIteRecur(dd,_topY,pDVar3,pDVar2);
          if (res1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
        }
      }
      cuddCacheInsert2(dd,Cudd_CProjection,R,Y,res1);
      dd_local = (DdManager *)res1;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddCProjectionRecur(
  DdManager * dd,
  DdNode * R,
  DdNode * Y,
  DdNode * Ysupp)
{
    DdNode *res, *res1, *res2, *resA;
    DdNode *r, *y, *RT, *RE, *YT, *YE, *Yrest, *Ra, *Ran, *Gamma, *Alpha;
    unsigned int topR, topY, top, index = 0;
    DdNode *one = DD_ONE(dd);

    statLine(dd);
    if (Y == one) return(R);

#ifdef DD_DEBUG
    assert(!Cudd_IsConstant(Y));
#endif

    if (R == Cudd_Not(one)) return(R);

    res = cuddCacheLookup2(dd, Cudd_CProjection, R, Y);
    if (res != NULL) return(res);

    r = Cudd_Regular(R);
    topR = cuddI(dd,r->index);
    y = Cudd_Regular(Y);
    topY = cuddI(dd,y->index);

    top = ddMin(topR, topY);

    /* Compute the cofactors of R */
    if (topR == top) {
        index = r->index;
        RT = cuddT(r);
        RE = cuddE(r);
        if (r != R) {
            RT = Cudd_Not(RT); RE = Cudd_Not(RE);
        }
    } else {
        RT = RE = R;
    }

    if (topY > top) {
        /* Y does not depend on the current top variable.
        ** We just need to compute the results on the two cofactors of R
        ** and make them the children of a node labeled r->index.
        */
        res1 = cuddCProjectionRecur(dd,RT,Y,Ysupp);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddCProjectionRecur(dd,RE,Y,Ysupp);
        if (res2 == NULL) {
            Cudd_RecursiveDeref(dd,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = cuddBddIteRecur(dd, dd->vars[index], res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd,res1);
            Cudd_RecursiveDeref(dd,res2);
            return(NULL);
        }
        /* If we have reached this point, res1 and res2 are now
        ** incorporated in res. cuddDeref is therefore sufficient.
        */
        cuddDeref(res1);
        cuddDeref(res2);
    } else {
        /* Compute the cofactors of Y */
        index = y->index;
        YT = cuddT(y);
        YE = cuddE(y);
        if (y != Y) {
            YT = Cudd_Not(YT); YE = Cudd_Not(YE);
        }
        if (YT == Cudd_Not(one)) {
            Alpha  = Cudd_Not(dd->vars[index]);
            Yrest = YE;
            Ra = RE;
            Ran = RT;
        } else {
            Alpha = dd->vars[index];
            Yrest = YT;
            Ra = RT;
            Ran = RE;
        }
        Gamma = cuddBddExistAbstractRecur(dd,Ra,cuddT(Ysupp));
        if (Gamma == NULL) return(NULL);
        if (Gamma == one) {
            res1 = cuddCProjectionRecur(dd,Ra,Yrest,cuddT(Ysupp));
            if (res1 == NULL) return(NULL);
            cuddRef(res1);
            res = cuddBddAndRecur(dd, Alpha, res1);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                return(NULL);
            }
            cuddDeref(res1);
        } else if (Gamma == Cudd_Not(one)) {
            res1 = cuddCProjectionRecur(dd,Ran,Yrest,cuddT(Ysupp));
            if (res1 == NULL) return(NULL);
            cuddRef(res1);
            res = cuddBddAndRecur(dd, Cudd_Not(Alpha), res1);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                return(NULL);
            }
            cuddDeref(res1);
        } else {
            cuddRef(Gamma);
            resA = cuddCProjectionRecur(dd,Ran,Yrest,cuddT(Ysupp));
            if (resA == NULL) {
                Cudd_RecursiveDeref(dd,Gamma);
                return(NULL);
            }
            cuddRef(resA);
            res2 = cuddBddAndRecur(dd, Cudd_Not(Gamma), resA);
            if (res2 == NULL) {
                Cudd_RecursiveDeref(dd,Gamma);
                Cudd_RecursiveDeref(dd,resA);
                return(NULL);
            }
            cuddRef(res2);
            Cudd_RecursiveDeref(dd,Gamma);
            Cudd_RecursiveDeref(dd,resA);
            res1 = cuddCProjectionRecur(dd,Ra,Yrest,cuddT(Ysupp));
            if (res1 == NULL) {
                Cudd_RecursiveDeref(dd,res2);
                return(NULL);
            }
            cuddRef(res1);
            res = cuddBddIteRecur(dd, Alpha, res1, res2);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                Cudd_RecursiveDeref(dd,res2);
                return(NULL);
            }
            cuddDeref(res1);
            cuddDeref(res2);
        }
    }

    cuddCacheInsert2(dd,Cudd_CProjection,R,Y,res);

    return(res);

}